

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pager_playback(Pager *pPager,int isHot)

{
  uint uVar1;
  sqlite3_vfs *psVar2;
  char *pcVar3;
  u32 uVar4;
  undefined1 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  sqlite3_file *p;
  undefined4 *p_00;
  char *zSuper;
  size_t sVar9;
  long lVar10;
  char *__s;
  bool bVar11;
  char *pcVar12;
  uint uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  u32 savedPageSize;
  int res;
  Pgno mxPg;
  u32 nRec;
  i64 szJ;
  i64 nSuperJournal;
  sqlite3_file *local_98;
  u32 local_60;
  int local_5c;
  u32 local_58;
  u32 local_54;
  undefined1 *local_50;
  int local_44;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = pPager->pVfs;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_54 = 0xaaaaaaaa;
  local_58 = 0;
  local_5c = 1;
  local_60 = (u32)pPager->pageSize;
  iVar6 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,(sqlite3_int64 *)&local_50);
  uVar13 = 0;
  if (iVar6 == 0) {
    pcVar12 = pPager->pTmpSpace;
    iVar6 = readSuperJournal(pPager->jfd,pcVar12,pPager->pVfs->mxPathname + 1);
    if (iVar6 == 0) {
      if (*pcVar12 == '\0') {
        iVar6 = 0;
      }
      else {
        iVar6 = (*psVar2->xAccess)(psVar2,pcVar12,0,&local_5c);
      }
    }
    uVar13 = 0;
    if ((iVar6 == 0) && (uVar13 = 0, local_5c != 0)) {
      pPager->journalOff = 0;
      iVar7 = readJournalHdr(pPager,isHot,(i64)local_50,&local_54,&local_58);
      if (iVar7 == 0) {
        uVar13 = 0;
        local_98._0_4_ = isHot;
        do {
          uVar4 = local_58;
          if (local_54 == 0xffffffff) {
            local_54 = (u32)((long)((long)local_50 - (ulong)pPager->sectorSize) /
                            (pPager->pageSize + 8));
          }
          if ((local_54 == 0 && isHot == 0) &&
             ((ulong)pPager->sectorSize + pPager->journalHdr == pPager->journalOff)) {
            local_54 = (u32)(((long)local_50 - pPager->journalOff) / (pPager->pageSize + 8));
          }
          if (pPager->journalOff == (ulong)pPager->sectorSize) {
            iVar6 = pager_truncate(pPager,local_58);
            if (iVar6 != 0) goto LAB_0013abe4;
            pPager->dbSize = uVar4;
            if (pPager->mxPgno < uVar4) {
              pPager->mxPgno = uVar4;
            }
          }
          if (local_54 != 0) {
            uVar1 = uVar13 + local_54;
            bVar14 = (int)local_98 == 0;
            iVar6 = -local_54;
            iVar7 = 0;
            do {
              if (!bVar14) {
                pager_reset(pPager);
              }
              iVar8 = pager_playback_one_page(pPager,&pPager->journalOff,(Bitvec *)0x0,1,0);
              if (iVar8 != 0) {
                if (iVar8 == 0x65) {
                  pPager->journalOff = (i64)local_50;
                  local_98._0_4_ = 0;
                  uVar13 = uVar13 - iVar7;
                  goto LAB_0013af41;
                }
                iVar6 = 0;
                if (iVar8 != 0x20a) {
                  iVar6 = iVar8;
                }
                uVar13 = uVar13 - iVar7;
                goto LAB_0013abe4;
              }
              iVar7 = iVar7 + -1;
              bVar14 = true;
            } while (iVar6 != iVar7);
            local_98._0_4_ = 0;
            uVar13 = uVar1;
          }
LAB_0013af41:
          iVar7 = readJournalHdr(pPager,isHot,(i64)local_50,&local_54,&local_58);
        } while (iVar7 == 0);
      }
      else {
        uVar13 = 0;
      }
      iVar6 = 0;
      if (iVar7 != 0x65) {
        iVar6 = iVar7;
      }
    }
  }
LAB_0013abe4:
  if (iVar6 == 0) {
    iVar6 = sqlite3PagerSetPagesize(pPager,&local_60,-1);
  }
  pPager->changeCountDone = pPager->tempFile;
  if (iVar6 == 0) {
    pcVar12 = pPager->pTmpSpace + 4;
    iVar6 = readSuperJournal(pPager->jfd,pcVar12,pPager->pVfs->mxPathname + 1);
  }
  else {
    pcVar12 = (char *)0x0;
  }
  if ((iVar6 == 0) && (iVar6 = 0, (byte)(pPager->eState - 4) < 0xfd)) {
    iVar6 = sqlite3PagerSync(pPager,(char *)0x0);
  }
  if (iVar6 == 0) {
    iVar6 = pager_end_transaction(pPager,(uint)(*pcVar12 != '\0'),0);
  }
  if (((iVar6 != 0) || (iVar6 = 0, *pcVar12 == '\0')) || (local_5c == 0)) goto LAB_0013acbb;
  pcVar3 = pPager->pTmpSpace;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  psVar2 = pPager->pVfs;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  p = (sqlite3_file *)sqlite3MallocZero((long)psVar2->szOsFile * 2);
  if (p == (sqlite3_file *)0x0) {
    iVar6 = 7;
    local_98 = (sqlite3_file *)0x0;
  }
  else {
    iVar6 = (*psVar2->xOpen)(psVar2,pcVar12,p,0x4001,(int *)0x0);
    local_98 = (sqlite3_file *)((long)&p->pMethods + (long)psVar2->szOsFile);
  }
  if (iVar6 == 0) {
    iVar6 = (*p->pMethods->xFileSize)(p,(sqlite3_int64 *)&local_40);
    if (iVar6 == 0) {
      iVar7 = psVar2->mxPathname;
      p_00 = (undefined4 *)sqlite3Malloc((u64)(local_40 + (long)iVar7 + 7));
      puVar5 = local_40;
      if (p_00 != (undefined4 *)0x0) {
        pcVar3 = (char *)(p_00 + 1);
        *p_00 = 0;
        iVar6 = (*p->pMethods->xRead)(p,pcVar3,(int)local_40,0);
        if (iVar6 == 0) {
          zSuper = (char *)((long)p_00 + (long)(puVar5 + 6));
          pcVar3[(long)local_40] = '\0';
          *(undefined1 *)((long)p_00 + (long)(local_40 + 5)) = 0;
          __s = pcVar3;
          do {
            if ((long)local_40 <= (long)__s - (long)pcVar3) {
              if (p->pMethods != (sqlite3_io_methods *)0x0) {
                (*p->pMethods->xClose)(p);
                p->pMethods = (sqlite3_io_methods *)0x0;
              }
              if (psVar2->xDelete == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                iVar6 = 0;
              }
              else {
                iVar6 = (*psVar2->xDelete)(psVar2,pcVar12,0);
              }
              goto LAB_0013afda;
            }
            local_44 = -0x55555556;
            iVar6 = (*psVar2->xAccess)(psVar2,__s,0,&local_44);
            if (iVar6 == 0) {
              if (local_44 == 0) {
                iVar6 = 0;
              }
              else {
                iVar6 = (*psVar2->xOpen)(psVar2,__s,local_98,0x4001,(int *)0x0);
                bVar14 = true;
                if (iVar6 == 0) {
                  iVar6 = readSuperJournal(local_98,zSuper,iVar7 + 1);
                  if (local_98->pMethods != (sqlite3_io_methods *)0x0) {
                    (*local_98->pMethods->xClose)(local_98);
                    local_98->pMethods = (sqlite3_io_methods *)0x0;
                  }
                  if (iVar6 == 0) {
                    iVar6 = 0;
                    if (*zSuper == '\0') {
                      bVar14 = false;
                    }
                    else {
                      iVar8 = strcmp(zSuper,pcVar12);
                      bVar14 = iVar8 == 0;
                    }
                    bVar11 = (bool)(bVar14 ^ 1);
                  }
                  else {
                    bVar11 = false;
                    bVar14 = true;
                  }
                }
                else {
                  bVar11 = false;
                }
                if (!bVar11) goto LAB_0013b16f;
              }
              if (__s == (char *)0x0) {
                lVar10 = 1;
              }
              else {
                sVar9 = strlen(__s);
                lVar10 = (ulong)((uint)sVar9 & 0x3fffffff) + 1;
              }
              __s = __s + lVar10;
              bVar14 = false;
            }
            else {
              bVar14 = true;
            }
LAB_0013b16f:
          } while (!bVar14);
          if (!bVar14) goto LAB_0013acbb;
        }
        goto LAB_0013afda;
      }
      iVar6 = 7;
    }
    p_00 = (undefined4 *)0x0;
  }
  else {
    p_00 = (undefined4 *)0x0;
  }
LAB_0013afda:
  sqlite3_free(p_00);
  if (p != (sqlite3_file *)0x0) {
    if (p->pMethods != (sqlite3_io_methods *)0x0) {
      (*p->pMethods->xClose)(p);
      p->pMethods = (sqlite3_io_methods *)0x0;
    }
    sqlite3_free(p);
  }
LAB_0013acbb:
  if ((isHot != 0) && (uVar13 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)uVar13,pPager->zJournal);
  }
  setSectorSize(pPager);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zSuper = 0;        /* Name of super-journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */
  u32 savedPageSize = pPager->pageSize;

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the super-journal name from the journal, if it is present.
  ** If a super-journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  ** mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zSuper = pPager->pTmpSpace;
  rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zSuper[0] ){
    rc = sqlite3OsAccess(pVfs, zSuper, SQLITE_ACCESS_EXISTS, &res);
  }
  zSuper = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error
  ** occurs.
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
      if( pPager->mxPgno<mxPg ){
        pPager->mxPgno = mxPg;
      }
    }

    /* Copy original pages out of the journal and back into the
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  if( rc==SQLITE_OK ){
    rc = sqlite3PagerSetPagesize(pPager, &savedPageSize, -1);
  }
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
#endif

  /* If this playback is happening automatically as a result of an IO or
  ** malloc error that occurred after the change-counter was updated but
  ** before the transaction was committed, then the change-counter
  ** modification may just have been reverted. If this happens in exclusive
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    /* Leave 4 bytes of space before the super-journal filename in memory.
    ** This is because it may end up being passed to sqlite3OsOpen(), in
    ** which case it requires 4 0x00 bytes in memory immediately before
    ** the filename. */
    zSuper = &pPager->pTmpSpace[4];
    rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zSuper[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zSuper[0] && res ){
    /* If there was a super-journal and this routine will return success,
    ** see if it is possible to delete the super-journal.
    */
    assert( zSuper==&pPager->pTmpSpace[4] );
    memset(pPager->pTmpSpace, 0, 4);
    rc = pager_delsuper(pPager, zSuper);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}